

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O3

void __thiscall AACCodec::buildADTSHeader(AACCodec *this,uint8_t *buffer,uint frameSize)

{
  int *piVar1;
  long lVar2;
  BitStreamWriter local_40;
  
  local_40.super_BitStream.m_totalBits = 0x38;
  local_40.m_curVal = 0;
  local_40.m_bitWrited = 0;
  local_40.super_BitStream.m_buffer = (uint *)buffer;
  local_40.super_BitStream.m_initBuffer = (uint *)buffer;
  BitStreamWriter::putBits(&local_40,0xc,0xfff);
  BitStreamWriter::putBits(&local_40,1,this->m_id);
  BitStreamWriter::putBits(&local_40,2,this->m_layer);
  BitStreamWriter::putBits(&local_40,1,1);
  BitStreamWriter::putBits(&local_40,2,(uint)this->m_profile);
  this->m_sample_rates_index = '\0';
  piVar1 = aac_sample_rates;
  lVar2 = 0;
  do {
    if (*piVar1 == this->m_sample_rate) {
      this->m_sample_rates_index = (uint8_t)lVar2;
      goto LAB_00173b3f;
    }
    lVar2 = lVar2 + 1;
    piVar1 = piVar1 + 1;
  } while (lVar2 != 0x10);
  lVar2 = 0;
LAB_00173b3f:
  BitStreamWriter::putBits(&local_40,4,(uint)lVar2);
  lVar2 = 0;
  BitStreamWriter::putBits(&local_40,1,0);
  this->m_channels_index = '\0';
  do {
    if (""[lVar2] == this->m_channels) {
      this->m_channels_index = (uint8_t)lVar2;
      goto LAB_00173b89;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  lVar2 = 0;
LAB_00173b89:
  BitStreamWriter::putBits(&local_40,3,(uint)lVar2);
  BitStreamWriter::putBits(&local_40,1,0);
  BitStreamWriter::putBits(&local_40,1,0);
  BitStreamWriter::putBits(&local_40,1,0);
  BitStreamWriter::putBits(&local_40,1,0);
  BitStreamWriter::putBits(&local_40,0xd,frameSize);
  BitStreamWriter::putBits(&local_40,0xb,0x7ff);
  BitStreamWriter::putBits(&local_40,2,(uint)this->m_rdb);
  BitStreamWriter::flushBits(&local_40);
  return;
}

Assistant:

void AACCodec::buildADTSHeader(uint8_t* buffer, const unsigned frameSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + AAC_HEADER_LEN);
    writer.putBits(12, 0xfff);
    writer.putBit(m_id);
    writer.putBits(2, m_layer);
    writer.putBit(1);  // protection_absent
    writer.putBits(2, m_profile);
    m_sample_rates_index = 0;
    for (uint8_t i = 0; i < 16; i++)
        if (aac_sample_rates[i] == m_sample_rate)
        {
            m_sample_rates_index = i;
            break;
        }
    writer.putBits(4, m_sample_rates_index);
    writer.putBit(0); /* private_bit */
    m_channels_index = 0;
    for (uint8_t i = 0; i < 8; i++)
        if (aac_channels[i] == m_channels)
        {
            m_channels_index = i;
            break;
        }
    writer.putBits(3, m_channels_index);

    writer.putBit(0); /* original/copy */
    writer.putBit(0); /* home */

    /* adts_variable_header */
    writer.putBit(0); /* copyright_identification_bit */
    writer.putBit(0); /* copyright_identification_start */

    writer.putBits(13, frameSize);  // /* aac_frame_length */
    writer.putBits(11, 2047);       // /* adts_buffer_fullness */
    writer.putBits(2, m_rdb);       /* number_of_raw_data_blocks_in_frame */
    writer.flushBits();
}